

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_embedded.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Config *pCVar1;
  char **argv_local;
  int argc_local;
  
  pCVar1 = trun::Config::Instance();
  pCVar1->verbose = 2;
  trun::AddTestCase("test_main",test_main);
  trun::AddTestCase("test_emb",test_emb);
  trun::AddTestCase("test_emb_exit",test_emb_exit);
  trun::AddTestCase("test_emb_func1",test_emb_func1);
  trun::AddTestCase("test_emb_func2",test_emb_func2);
  trun::RunTests("-","-");
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    // Increase log-level - this is an explicit thing in embedded, by default it is all switched off...
    // Testrunner will read the verbose level from config (normally comes from cmd-line parsing) and update the log-level in the logger..
    trun::Config::Instance().verbose = 2;

    // Add some test cases
    trun::AddTestCase("test_main", test_main);
    trun::AddTestCase("test_emb", test_emb);
    trun::AddTestCase("test_emb_exit", test_emb_exit);
    trun::AddTestCase("test_emb_func1",  test_emb_func1);
    trun::AddTestCase("test_emb_func2", test_emb_func2);

    // Run some tests...
    trun::RunTests("-", "-");

    return 0;
}